

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageBuffer::~RenderFragmentStorageBuffer
          (RenderFragmentStorageBuffer *this)

{
  RenderFragmentStorageBuffer *this_local;
  
  ~RenderFragmentStorageBuffer(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

RenderFragmentStorageBuffer::~RenderFragmentStorageBuffer (void)
{
}